

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDirEntryWrapper.cpp
# Opt level: O3

bufsize_t __thiscall
DataDirEntryWrapper::getDirEntrySize(DataDirEntryWrapper *this,bool trimToExeSize)

{
  PEFile *pPVar1;
  Executable *pEVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  DataDirWrapper *this_00;
  size_t sVar5;
  IMAGE_DATA_DIRECTORY *pIVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar7;
  ulong uVar8;
  
  pPVar1 = (this->super_PENodeWrapper).m_PE;
  iVar3 = (*(pPVar1->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer[2])
                    (&(pPVar1->super_MappedExe).super_ExeWrappersContainer,4);
  if (CONCAT44(extraout_var,iVar3) != 0) {
    this_00 = (DataDirWrapper *)
              __dynamic_cast(CONCAT44(extraout_var,iVar3),&ExeElementWrapper::typeinfo,
                             &DataDirWrapper::typeinfo,0);
    if (this_00 == (DataDirWrapper *)0x0) {
      return 0;
    }
    sVar5 = DataDirWrapper::getDirsCount(this_00);
    if ((((ulong)(long)this->entryType < sVar5) &&
        (pPVar1 = (this->super_PENodeWrapper).m_PE, pPVar1 != (PEFile *)0x0)) &&
       (pIVar6 = PEFile::getDataDirectory(pPVar1), pIVar6 != (IMAGE_DATA_DIRECTORY *)0x0)) {
      uVar8 = (ulong)pIVar6[this->entryType].Size;
      if (!trimToExeSize) {
        return uVar8;
      }
      pEVar2 = (this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.m_Exe;
      if (pEVar2 != (Executable *)0x0) {
        iVar3 = (*(pEVar2->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x1a])
                          (pEVar2,(ulong)pIVar6[this->entryType].VirtualAddress);
        if (CONCAT44(extraout_var_00,iVar3) != -1) {
          iVar4 = (*(((this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.m_Exe
                     )->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[2])();
          uVar7 = CONCAT44(extraout_var_01,iVar4) - CONCAT44(extraout_var_00,iVar3);
          if (uVar7 < uVar8) {
            return uVar7;
          }
          return uVar8;
        }
      }
    }
  }
  return 0;
}

Assistant:

bufsize_t DataDirEntryWrapper::getDirEntrySize(bool trimToExeSize)
{
    DataDirWrapper *dDir = dynamic_cast<DataDirWrapper*>(m_PE->getWrapper(PEFile::WR_DATADIR));
    const size_t recordsCount = dDir ? dDir->getDirsCount() : 0;
    if (this->entryType >= recordsCount) return 0;
    
    IMAGE_DATA_DIRECTORY *d = getDataDirectory();
    if (!d) return 0;
    
    bufsize_t dirSize = static_cast<bufsize_t>(d[this->entryType].Size);
    if (!trimToExeSize) {
        return dirSize;
    }
    
    if (!this->m_Exe) return 0; // should never happen
    
    offset_t dirRva = d[this->entryType].VirtualAddress;
    offset_t dirRaw = this->m_Exe->rvaToRaw(dirRva);
    if (dirRaw == INVALID_ADDR) {
        return 0;
    }
    bufsize_t fullSize = this->m_Exe->getContentSize();
    bufsize_t remainingSize = bufsize_t(fullSize - dirRaw);
    
    return (dirSize < remainingSize) ? dirSize : remainingSize;
}